

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

Status cmsys::SystemTools::RemoveADirectory(string *source)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  undefined1 local_78 [8];
  string fullPath;
  size_t fileNum;
  Directory local_38;
  Directory dir;
  Status local_24;
  mode_t local_1c;
  string *psStack_18;
  mode_t mode;
  string *source_local;
  Status status;
  
  local_1c = 0;
  psStack_18 = source;
  local_24 = GetPermissions(source,&local_1c);
  bVar2 = Status::operator_cast_to_bool(&local_24);
  if (bVar2) {
    local_1c = local_1c | 0x180;
    register0x00000000 = SetPermissions(psStack_18,local_1c,false);
  }
  Status::Status((Status *)&source_local);
  Directory::Directory(&local_38);
  source_local = (string *)Directory::Load(&local_38,psStack_18,(string *)0x0);
  bVar2 = Status::IsSuccess((Status *)&source_local);
  if (bVar2) {
    for (fullPath.field_2._8_8_ = 0; uVar1 = fullPath.field_2._8_8_,
        uVar4 = Directory::GetNumberOfFiles(&local_38), (ulong)uVar1 < uVar4;
        fullPath.field_2._8_8_ = fullPath.field_2._8_8_ + 1) {
      pcVar5 = Directory::GetFile(&local_38,fullPath.field_2._8_8_);
      iVar3 = strcmp(pcVar5,".");
      if (iVar3 != 0) {
        pcVar5 = Directory::GetFile(&local_38,fullPath.field_2._8_8_);
        iVar3 = strcmp(pcVar5,"..");
        if (iVar3 != 0) {
          std::__cxx11::string::string((string *)local_78,(string *)psStack_18);
          std::__cxx11::string::operator+=((string *)local_78,"/");
          pcVar5 = Directory::GetFile(&local_38,fullPath.field_2._8_8_);
          std::__cxx11::string::operator+=((string *)local_78,pcVar5);
          bVar2 = FileIsDirectory((string *)local_78);
          if ((!bVar2) || (bVar2 = FileIsSymlink((string *)local_78), bVar2)) {
            source_local = (string *)RemoveFile((string *)local_78);
            bVar2 = Status::IsSuccess((Status *)&source_local);
            if (bVar2) {
LAB_00a9ea30:
              bVar2 = false;
            }
            else {
              bVar2 = true;
            }
          }
          else {
            source_local = (string *)RemoveADirectory((string *)local_78);
            bVar2 = Status::IsSuccess((Status *)&source_local);
            if (bVar2) goto LAB_00a9ea30;
            bVar2 = true;
          }
          std::__cxx11::string::~string((string *)local_78);
          if (bVar2) goto LAB_00a9eaa8;
        }
      }
    }
    iVar3 = Rmdir(psStack_18);
    if (iVar3 != 0) {
      source_local = (string *)Status::POSIX_errno();
    }
  }
LAB_00a9eaa8:
  Directory::~Directory(&local_38);
  return (Status)source_local;
}

Assistant:

Status SystemTools::RemoveADirectory(std::string const& source)
{
  // Add read and write permission to the directory so we can read
  // and modify its content to remove files and directories from it.
  mode_t mode = 0;
  if (SystemTools::GetPermissions(source, mode)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IREAD | S_IWRITE;
#else
    mode |= S_IRUSR | S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
  }

  Status status;
  Directory dir;
  status = dir.Load(source);
  if (!status.IsSuccess()) {
    return status;
  }

  size_t fileNum;
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") != 0 &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..") != 0) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath) &&
          !SystemTools::FileIsSymlink(fullPath)) {
        status = SystemTools::RemoveADirectory(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      } else {
        status = SystemTools::RemoveFile(fullPath);
        if (!status.IsSuccess()) {
          return status;
        }
      }
    }
  }

  if (Rmdir(source) != 0) {
    status = Status::POSIX_errno();
  }
  return status;
}